

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

int socket_server_udp_connect(socket_server *ss,int id,char *addr,int port)

{
  sockaddr *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  addrinfo *ai_list;
  char portstr [16];
  request_package request;
  addrinfo *local_280;
  char local_278 [16];
  addrinfo local_268;
  request_package local_230;
  
  local_280 = (addrinfo *)0x0;
  sprintf(local_278,"%d",(ulong)(uint)port);
  local_268.ai_flags = 0;
  local_268.ai_family = 0;
  local_268.ai_addrlen = 0;
  local_268._20_4_ = 0;
  local_268.ai_addr = (sockaddr *)0x0;
  local_268.ai_canonname = (char *)0x0;
  local_268.ai_next = (addrinfo *)0x0;
  local_268.ai_socktype = 2;
  local_268.ai_protocol = 0x11;
  iVar3 = getaddrinfo(addr,local_278,&local_268,&local_280);
  iVar4 = -1;
  if (iVar3 == 0) {
    local_230.u.open.id = id;
    if (local_280->ai_family == 2) {
      bVar2 = true;
      local_230.u.buffer[4] = '\x01';
    }
    else {
      if (local_280->ai_family != 10) {
        freeaddrinfo(local_280);
        return -1;
      }
      local_230.u.buffer[4] = '\x02';
      bVar2 = false;
    }
    psVar1 = local_280->ai_addr;
    local_230.u.open.port._1_2_ = *(undefined2 *)psVar1->sa_data;
    if (bVar2) {
      local_230.u._7_4_ = *(undefined4 *)(psVar1->sa_data + 2);
      iVar3 = 0xc;
    }
    else {
      local_230.u._7_8_ = *(undefined8 *)(psVar1->sa_data + 6);
      local_230.u._15_2_ = psVar1[1].sa_family;
      local_230.u._17_1_ = psVar1[1].sa_data[0];
      local_230.u._18_1_ = psVar1[1].sa_data[1];
      local_230.u._19_1_ = psVar1[1].sa_data[2];
      local_230.u._20_1_ = psVar1[1].sa_data[3];
      local_230.u._21_1_ = psVar1[1].sa_data[4];
      local_230.u._22_1_ = psVar1[1].sa_data[5];
      iVar3 = 0x18;
    }
    freeaddrinfo(local_280);
    send_request(ss,&local_230,'C',iVar3);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
socket_server_udp_connect(struct socket_server *ss, int id, const char * addr, int port) {
	int status;
	struct addrinfo ai_hints;
	struct addrinfo *ai_list = NULL;
	char portstr[16];
	sprintf(portstr, "%d", port);
	memset( &ai_hints, 0, sizeof( ai_hints ) );
	ai_hints.ai_family = AF_UNSPEC;
	ai_hints.ai_socktype = SOCK_DGRAM;
	ai_hints.ai_protocol = IPPROTO_UDP;

	status = getaddrinfo(addr, portstr, &ai_hints, &ai_list );
	if ( status != 0 ) {
		return -1;
	}
	struct request_package request;
	request.u.set_udp.id = id;
	int protocol;

	if (ai_list->ai_family == AF_INET) {
		protocol = PROTOCOL_UDP;
	} else if (ai_list->ai_family == AF_INET6) {
		protocol = PROTOCOL_UDPv6;
	} else {
		freeaddrinfo( ai_list );
		return -1;
	}

	int addrsz = gen_udp_address(protocol, (union sockaddr_all *)ai_list->ai_addr, request.u.set_udp.address);

	freeaddrinfo( ai_list );

	send_request(ss, &request, 'C', sizeof(request.u.set_udp) - sizeof(request.u.set_udp.address) +addrsz);

	return 0;
}